

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VBufUnpack(N_Vector x,void *buf)

{
  SUNErrCode SVar1;
  undefined8 in_RSI;
  long in_RDI;
  SUNErrCode ier;
  SUNContext sunctx_local_scope_;
  
  SVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x1a8))(in_RDI,in_RSI);
  return SVar1;
}

Assistant:

SUNErrCode N_VBufUnpack(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  SUNErrCode ier = SUN_SUCCESS;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));
  SUNAssert(x->ops->nvbufunpack, SUN_ERR_NOT_IMPLEMENTED);
  ier = x->ops->nvbufunpack(x, buf);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return (ier);
}